

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int trie_get_children(trie_node *root_node,trie_node ***array,uint *len)

{
  uint uVar1;
  long lVar2;
  trie_node *ptVar3;
  int iVar4;
  int iVar5;
  trie_node **pptVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar3 = root_node->lchild;
  if (ptVar3 == (trie_node *)0x0) {
LAB_00111bff:
    ptVar3 = root_node->rchild;
    iVar4 = 0;
    if (ptVar3 == (trie_node *)0x0) goto LAB_00111c50;
    uVar1 = *len;
    *len = uVar1 + 1;
    pptVar6 = (trie_node **)lrtr_realloc(*array,(ulong)(uVar1 + 1) << 6);
    if (pptVar6 != (trie_node **)0x0) {
      *array = pptVar6;
      pptVar6[*len - 1] = ptVar3;
      iVar5 = trie_get_children(root_node->rchild,array,len);
      iVar4 = 0;
      if (iVar5 != -1) goto LAB_00111c50;
    }
  }
  else {
    uVar1 = *len;
    *len = uVar1 + 1;
    pptVar6 = (trie_node **)lrtr_realloc(*array,(ulong)(uVar1 + 1) << 6);
    if (pptVar6 != (trie_node **)0x0) {
      *array = pptVar6;
      pptVar6[*len - 1] = ptVar3;
      iVar4 = trie_get_children(root_node->lchild,array,len);
      if (iVar4 != -1) goto LAB_00111bff;
    }
  }
  lrtr_free(*array);
  iVar4 = -1;
LAB_00111c50:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int trie_get_children(const struct trie_node *root_node, struct trie_node ***array, unsigned int *len)
{
	if (root_node->lchild) {
		*len += 1;
		if (append_node_to_array(array, len, root_node->lchild))
			goto err;

		if (trie_get_children(root_node->lchild, array, len) == -1)
			goto err;
	}

	if (root_node->rchild) {
		*len += 1;
		if (append_node_to_array(array, len, root_node->rchild))
			goto err;

		if (trie_get_children(root_node->rchild, array, len) == -1)
			goto err;
	}

	return 0;

err:
	lrtr_free(*array);
	return -1;
}